

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

MAP_RESULT Map_Delete(MAP_HANDLE handle,char *key)

{
  LOGGER_LOG p_Var1;
  char *pcVar2;
  char **ppcVar3;
  long lVar4;
  size_t index;
  char **whereIsIt;
  MAP_HANDLE_DATA *handleData;
  LOGGER_LOG l;
  MAP_RESULT result;
  char *key_local;
  MAP_HANDLE handle_local;
  
  if ((handle == (MAP_HANDLE)0x0) || (key == (char *)0x0)) {
    l._4_4_ = MAP_INVALIDARG;
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      pcVar2 = MAP_RESULTStrings(MAP_INVALIDARG);
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/deps/c-utility/src/map.c"
                ,"Map_Delete",0x1d5,1,"result = %s%s (%d)","",pcVar2,3);
    }
  }
  else {
    ppcVar3 = findKey(handle,key);
    if (ppcVar3 == (char **)0x0) {
      l._4_4_ = MAP_KEYNOTFOUND;
    }
    else {
      lVar4 = (long)ppcVar3 - (long)handle->keys >> 3;
      free(handle->keys[lVar4]);
      free(handle->values[lVar4]);
      memmove(handle->keys + lVar4,handle->keys + lVar4 + 1,((handle->count - lVar4) + -1) * 8);
      memmove(handle->values + lVar4,handle->values + lVar4 + 1,((handle->count - lVar4) + -1) * 8);
      Map_DecreaseStorageKeysValues(handle);
      l._4_4_ = MAP_OK;
    }
  }
  return l._4_4_;
}

Assistant:

MAP_RESULT Map_Delete(MAP_HANDLE handle, const char* key)
{
    MAP_RESULT result;
    /*Codes_SRS_MAP_02_020: [If parameter handle is NULL then Map_Delete shall return MAP_INVALIDARG.]*/
    /*Codes_SRS_MAP_02_021: [If parameter key is NULL then Map_Delete shall return MAP_INVALIDARG.]*/
    if (
        (handle == NULL) ||
        (key == NULL)
        )
    {
        result = MAP_INVALIDARG;
        LOG_MAP_ERROR;
    }
    else
    {
        MAP_HANDLE_DATA* handleData = (MAP_HANDLE_DATA*)handle;
        char** whereIsIt = findKey(handleData,key);
        if (whereIsIt == NULL)
        {
            /*Codes_SRS_MAP_02_022: [If key does not exist then Map_Delete shall return MAP_KEYNOTFOUND.]*/
            result = MAP_KEYNOTFOUND;
        }
        else
        {
            /*Codes_SRS_MAP_02_023: [Otherwise, Map_Delete shall remove the key and its associated value from the map and return MAP_OK.]*/
            size_t index = whereIsIt - handleData->keys;
            free(handleData->keys[index]);
            free(handleData->values[index]);
            memmove(handleData->keys + index, handleData->keys + index + 1, (handleData->count - index - 1)*sizeof(char*)); /*if order doesn't matter... then this can be optimized*/
            memmove(handleData->values + index, handleData->values + index + 1, (handleData->count - index - 1)*sizeof(char*));
            Map_DecreaseStorageKeysValues(handleData);
            result = MAP_OK;
        }

    }
    return result;
}